

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

void __thiscall PrintfTest_Examples_Test::TestBody(PrintfTest_Examples_Test *this)

{
  bool bVar1;
  AssertionResult *pAVar2;
  char *message;
  int day;
  string gtest_output;
  OutputRedirect gtest_redir;
  string gtest_expected_output;
  AssertionResult gtest_ar;
  char *month;
  char *weekday;
  
  weekday = "Thursday";
  month = "August";
  day = 0x15;
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_output,"Thursday, 21 August",(allocator *)&gtest_output);
    OutputRedirect::OutputRedirect(&gtest_redir,_stdout);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::printf<char[16],char_const*,char_const*,int>
                ((char (*) [16])"%1$s, %3$d %2$s",&weekday,&month,&day);
    }
    OutputRedirect::restore_and_read_abi_cxx11_(&gtest_output,&gtest_redir);
    bVar1 = std::operator!=(&gtest_output,&gtest_expected_output);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&gtest_output);
      OutputRedirect::~OutputRedirect(&gtest_redir);
      std::__cxx11::string::~string((string *)&gtest_expected_output);
      goto LAB_0011fbdc;
    }
    pAVar2 = testing::AssertionResult::operator<<
                       (&gtest_ar,
                        (char (*) [80])
                        "fmt::printf(\"%1$s, %3$d %2$s\", weekday, month, day) produces different output.\n"
                       );
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x19e7e5);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&gtest_expected_output);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x19eeaf);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x19e7d9);
    testing::AssertionResult::operator<<(pAVar2,&gtest_output);
    std::__cxx11::string::~string((string *)&gtest_output);
    OutputRedirect::~OutputRedirect(&gtest_redir);
    std::__cxx11::string::~string((string *)&gtest_expected_output);
  }
  testing::Message::Message((Message *)&gtest_expected_output);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_output,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
             ,0x1e8,message);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_output,(Message *)&gtest_expected_output);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_output);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_output);
LAB_0011fbdc:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(PrintfTest, Examples) {
  const char *weekday = "Thursday";
  const char *month = "August";
  int day = 21;
  EXPECT_WRITE(stdout, fmt::printf("%1$s, %3$d %2$s", weekday, month, day),
               "Thursday, 21 August");
}